

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

Attribute * __thiscall Assimp::CFIReaderImpl::getAttributeByName(CFIReaderImpl *this,char *name)

{
  __type _Var1;
  size_type sVar2;
  const_reference pvVar3;
  int local_58;
  int i;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string n;
  char *name_local;
  CFIReaderImpl *this_local;
  
  if (name == (char *)0x0) {
    this_local = (CFIReaderImpl *)0x0;
  }
  else {
    n.field_2._8_8_ = name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,name,&local_41);
    std::allocator<char>::~allocator(&local_41);
    local_58 = 0;
    while( true ) {
      sVar2 = std::
              vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
              ::size(&this->attributes);
      if ((int)sVar2 <= local_58) break;
      pvVar3 = std::
               vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
               ::operator[](&this->attributes,(long)local_58);
      _Var1 = std::operator==(&pvVar3->name,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40);
      if (_Var1) {
        this_local = (CFIReaderImpl *)
                     std::
                     vector<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                     ::operator[](&this->attributes,(long)local_58);
        goto LAB_00abef08;
      }
      local_58 = local_58 + 1;
    }
    this_local = (CFIReaderImpl *)0x0;
LAB_00abef08:
    std::__cxx11::string::~string((string *)local_40);
  }
  return (Attribute *)this_local;
}

Assistant:

const Attribute* getAttributeByName(const char* name) const {
        if (!name) {
            return 0;
        }
        std::string n = name;
        for (int i=0; i<(int)attributes.size(); ++i) {
            if (attributes[i].name == n) {
                return &attributes[i];
            }
        }
        return 0;
    }